

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_types.cpp
# Opt level: O3

void duckdb_parquet::swap(OffsetIndex *a,OffsetIndex *b)

{
  _OffsetIndex__isset _Var1;
  pointer pPVar2;
  pointer plVar3;
  pointer pPVar4;
  pointer pPVar5;
  pointer pPVar6;
  pointer plVar7;
  pointer plVar8;
  pointer plVar9;
  vector<duckdb_parquet::PageLocation,_std::allocator<duckdb_parquet::PageLocation>_> local_68;
  vector<duckdb_parquet::PageLocation,_std::allocator<duckdb_parquet::PageLocation>_> local_48;
  
  pPVar2 = (a->page_locations).
           super_vector<duckdb_parquet::PageLocation,_std::allocator<duckdb_parquet::PageLocation>_>
           .
           super__Vector_base<duckdb_parquet::PageLocation,_std::allocator<duckdb_parquet::PageLocation>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
  pPVar4 = (a->page_locations).
           super_vector<duckdb_parquet::PageLocation,_std::allocator<duckdb_parquet::PageLocation>_>
           .
           super__Vector_base<duckdb_parquet::PageLocation,_std::allocator<duckdb_parquet::PageLocation>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pPVar5 = (a->page_locations).
           super_vector<duckdb_parquet::PageLocation,_std::allocator<duckdb_parquet::PageLocation>_>
           .
           super__Vector_base<duckdb_parquet::PageLocation,_std::allocator<duckdb_parquet::PageLocation>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  (a->page_locations).
  super_vector<duckdb_parquet::PageLocation,_std::allocator<duckdb_parquet::PageLocation>_>.
  super__Vector_base<duckdb_parquet::PageLocation,_std::allocator<duckdb_parquet::PageLocation>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (a->page_locations).
  super_vector<duckdb_parquet::PageLocation,_std::allocator<duckdb_parquet::PageLocation>_>.
  super__Vector_base<duckdb_parquet::PageLocation,_std::allocator<duckdb_parquet::PageLocation>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (a->page_locations).
  super_vector<duckdb_parquet::PageLocation,_std::allocator<duckdb_parquet::PageLocation>_>.
  super__Vector_base<duckdb_parquet::PageLocation,_std::allocator<duckdb_parquet::PageLocation>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pPVar6 = (b->page_locations).
           super_vector<duckdb_parquet::PageLocation,_std::allocator<duckdb_parquet::PageLocation>_>
           .
           super__Vector_base<duckdb_parquet::PageLocation,_std::allocator<duckdb_parquet::PageLocation>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  (a->page_locations).
  super_vector<duckdb_parquet::PageLocation,_std::allocator<duckdb_parquet::PageLocation>_>.
  super__Vector_base<duckdb_parquet::PageLocation,_std::allocator<duckdb_parquet::PageLocation>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (b->page_locations).
       super_vector<duckdb_parquet::PageLocation,_std::allocator<duckdb_parquet::PageLocation>_>.
       super__Vector_base<duckdb_parquet::PageLocation,_std::allocator<duckdb_parquet::PageLocation>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (a->page_locations).
  super_vector<duckdb_parquet::PageLocation,_std::allocator<duckdb_parquet::PageLocation>_>.
  super__Vector_base<duckdb_parquet::PageLocation,_std::allocator<duckdb_parquet::PageLocation>_>.
  _M_impl.super__Vector_impl_data._M_finish = pPVar6;
  (a->page_locations).
  super_vector<duckdb_parquet::PageLocation,_std::allocator<duckdb_parquet::PageLocation>_>.
  super__Vector_base<duckdb_parquet::PageLocation,_std::allocator<duckdb_parquet::PageLocation>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       (b->page_locations).
       super_vector<duckdb_parquet::PageLocation,_std::allocator<duckdb_parquet::PageLocation>_>.
       super__Vector_base<duckdb_parquet::PageLocation,_std::allocator<duckdb_parquet::PageLocation>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_68.
  super__Vector_base<duckdb_parquet::PageLocation,_std::allocator<duckdb_parquet::PageLocation>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_68.
  super__Vector_base<duckdb_parquet::PageLocation,_std::allocator<duckdb_parquet::PageLocation>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.
  super__Vector_base<duckdb_parquet::PageLocation,_std::allocator<duckdb_parquet::PageLocation>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (b->page_locations).
  super_vector<duckdb_parquet::PageLocation,_std::allocator<duckdb_parquet::PageLocation>_>.
  super__Vector_base<duckdb_parquet::PageLocation,_std::allocator<duckdb_parquet::PageLocation>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (b->page_locations).
  super_vector<duckdb_parquet::PageLocation,_std::allocator<duckdb_parquet::PageLocation>_>.
  super__Vector_base<duckdb_parquet::PageLocation,_std::allocator<duckdb_parquet::PageLocation>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (b->page_locations).
  super_vector<duckdb_parquet::PageLocation,_std::allocator<duckdb_parquet::PageLocation>_>.
  super__Vector_base<duckdb_parquet::PageLocation,_std::allocator<duckdb_parquet::PageLocation>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  std::vector<duckdb_parquet::PageLocation,_std::allocator<duckdb_parquet::PageLocation>_>::~vector
            (&local_68);
  local_68.
  super__Vector_base<duckdb_parquet::PageLocation,_std::allocator<duckdb_parquet::PageLocation>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       (b->page_locations).
       super_vector<duckdb_parquet::PageLocation,_std::allocator<duckdb_parquet::PageLocation>_>.
       super__Vector_base<duckdb_parquet::PageLocation,_std::allocator<duckdb_parquet::PageLocation>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (b->page_locations).
  super_vector<duckdb_parquet::PageLocation,_std::allocator<duckdb_parquet::PageLocation>_>.
  super__Vector_base<duckdb_parquet::PageLocation,_std::allocator<duckdb_parquet::PageLocation>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = pPVar2;
  local_68.
  super__Vector_base<duckdb_parquet::PageLocation,_std::allocator<duckdb_parquet::PageLocation>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (b->page_locations).
       super_vector<duckdb_parquet::PageLocation,_std::allocator<duckdb_parquet::PageLocation>_>.
       super__Vector_base<duckdb_parquet::PageLocation,_std::allocator<duckdb_parquet::PageLocation>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_68.
  super__Vector_base<duckdb_parquet::PageLocation,_std::allocator<duckdb_parquet::PageLocation>_>.
  _M_impl.super__Vector_impl_data._M_finish =
       (b->page_locations).
       super_vector<duckdb_parquet::PageLocation,_std::allocator<duckdb_parquet::PageLocation>_>.
       super__Vector_base<duckdb_parquet::PageLocation,_std::allocator<duckdb_parquet::PageLocation>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  (b->page_locations).
  super_vector<duckdb_parquet::PageLocation,_std::allocator<duckdb_parquet::PageLocation>_>.
  super__Vector_base<duckdb_parquet::PageLocation,_std::allocator<duckdb_parquet::PageLocation>_>.
  _M_impl.super__Vector_impl_data._M_start = pPVar4;
  (b->page_locations).
  super_vector<duckdb_parquet::PageLocation,_std::allocator<duckdb_parquet::PageLocation>_>.
  super__Vector_base<duckdb_parquet::PageLocation,_std::allocator<duckdb_parquet::PageLocation>_>.
  _M_impl.super__Vector_impl_data._M_finish = pPVar5;
  local_48.
  super__Vector_base<duckdb_parquet::PageLocation,_std::allocator<duckdb_parquet::PageLocation>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.
  super__Vector_base<duckdb_parquet::PageLocation,_std::allocator<duckdb_parquet::PageLocation>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.
  super__Vector_base<duckdb_parquet::PageLocation,_std::allocator<duckdb_parquet::PageLocation>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<duckdb_parquet::PageLocation,_std::allocator<duckdb_parquet::PageLocation>_>::~vector
            (&local_68);
  std::vector<duckdb_parquet::PageLocation,_std::allocator<duckdb_parquet::PageLocation>_>::~vector
            (&local_48);
  plVar3 = (a->unencoded_byte_array_data_bytes).super_vector<long,_std::allocator<long>_>.
           super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
           _M_end_of_storage;
  plVar7 = (a->unencoded_byte_array_data_bytes).super_vector<long,_std::allocator<long>_>.
           super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start;
  plVar8 = (a->unencoded_byte_array_data_bytes).super_vector<long,_std::allocator<long>_>.
           super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_finish
  ;
  (a->unencoded_byte_array_data_bytes).super_vector<long,_std::allocator<long>_>.
  super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  (a->unencoded_byte_array_data_bytes).super_vector<long,_std::allocator<long>_>.
  super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  (a->unencoded_byte_array_data_bytes).super_vector<long,_std::allocator<long>_>.
  super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_end_of_storage
       = (pointer)0x0;
  plVar9 = (b->unencoded_byte_array_data_bytes).super_vector<long,_std::allocator<long>_>.
           super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_finish
  ;
  (a->unencoded_byte_array_data_bytes).super_vector<long,_std::allocator<long>_>.
  super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start =
       (b->unencoded_byte_array_data_bytes).super_vector<long,_std::allocator<long>_>.
       super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start;
  (a->unencoded_byte_array_data_bytes).super_vector<long,_std::allocator<long>_>.
  super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_finish = plVar9
  ;
  (a->unencoded_byte_array_data_bytes).super_vector<long,_std::allocator<long>_>.
  super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_end_of_storage
       = (b->unencoded_byte_array_data_bytes).super_vector<long,_std::allocator<long>_>.
         super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
         _M_end_of_storage;
  (b->unencoded_byte_array_data_bytes).super_vector<long,_std::allocator<long>_>.
  super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start = plVar7;
  (b->unencoded_byte_array_data_bytes).super_vector<long,_std::allocator<long>_>.
  super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_finish = plVar8
  ;
  (b->unencoded_byte_array_data_bytes).super_vector<long,_std::allocator<long>_>.
  super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_end_of_storage
       = plVar3;
  _Var1 = a->__isset;
  a->__isset = b->__isset;
  b->__isset = _Var1;
  return;
}

Assistant:

void swap(OffsetIndex &a, OffsetIndex &b) {
  using ::std::swap;
  swap(a.page_locations, b.page_locations);
  swap(a.unencoded_byte_array_data_bytes, b.unencoded_byte_array_data_bytes);
  swap(a.__isset, b.__isset);
}